

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,ptls_aead_context_t *aead)

{
  undefined1 local_4144;
  undefined1 local_4143;
  undefined2 local_4142;
  undefined1 local_413f;
  undefined1 local_413e;
  undefined1 local_413d;
  int iStack_413c;
  uint16_t _v;
  ulong uStack_4138;
  int ret;
  size_t bodylen;
  size_t enclen;
  uint8_t encrypted [16640];
  ptls_aead_context_t *aead_local;
  size_t rec_start_local;
  ptls_buffer_t *buf_local;
  
  uStack_4138 = (buf->off - rec_start) - 5;
  if (0x4000 < uStack_4138) {
    __assert_fail("bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x15b,"int buffer_encrypt_record(ptls_buffer_t *, size_t, ptls_aead_context_t *)"
                 );
  }
  iStack_413c = ptls_aead_transform(aead,&enclen,&bodylen,buf->base + rec_start + 5,uStack_4138,
                                    buf->base[rec_start]);
  if (iStack_413c == 0) {
    buf->off = rec_start;
    local_413f = 0x17;
    local_413e = 3;
    local_413d = 1;
    iStack_413c = ptls_buffer__do_pushv(buf,&local_413f,3);
    if (iStack_413c == 0) {
      local_4142 = (undefined2)bodylen;
      local_4144 = (undefined1)(bodylen >> 8);
      local_4143 = (undefined1)bodylen;
      iStack_413c = ptls_buffer__do_pushv(buf,&local_4144,2);
      if (iStack_413c == 0) {
        iStack_413c = ptls_buffer__do_pushv(buf,&enclen,bodylen);
      }
    }
  }
  return iStack_413c;
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, ptls_aead_context_t *aead)
{
    uint8_t encrypted[PTLS_MAX_ENCRYPTED_RECORD_SIZE];
    size_t enclen, bodylen = buf->off - rec_start - 5;
    int ret;

    assert(bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE);

    if ((ret = ptls_aead_transform(aead, encrypted, &enclen, buf->base + rec_start + 5, bodylen, buf->base[rec_start])) != 0)
        goto Exit;
    buf->off = rec_start;
    ptls_buffer_push(buf, PTLS_CONTENT_TYPE_APPDATA, 3, 1);
    ptls_buffer_push16(buf, enclen);
    ptls_buffer_pushv(buf, encrypted, enclen);

Exit:
    return ret;
}